

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O3

wchar_t cmp_pkill(void *a,void *b)

{
  wchar_t wVar1;
  
  wVar1 = L'\xffffffff';
  if (l_list[*b].pkills <= l_list[*a].pkills) {
    if (l_list[*b].pkills < l_list[*a].pkills) {
      return L'\x01';
    }
    if ((l_list[*b].tkills <= l_list[*a].tkills) &&
       (wVar1 = L'\x01', l_list[*a].tkills <= l_list[*b].tkills)) {
      wVar1 = L'\xffffffff';
      if (r_info[*b].level <= r_info[*a].level) {
        if (r_info[*b].level < r_info[*a].level) {
          return L'\x01';
        }
        if ((r_info[*b].mexp <= r_info[*a].mexp) &&
           (wVar1 = L'\x01', r_info[*a].mexp <= r_info[*b].mexp)) {
          wVar1 = L'\xffffffff';
          if (b <= a) {
            wVar1 = (wchar_t)(b < a);
          }
          return wVar1;
        }
      }
      return wVar1;
    }
  }
  return wVar1;
}

Assistant:

static int cmp_pkill(const void *a, const void *b)
{
	uint16_t ia = *(const uint16_t *)a;
	uint16_t ib = *(const uint16_t *)b;
	if (l_list[ia].pkills < l_list[ib].pkills)
		return -1;
	if (l_list[ia].pkills > l_list[ib].pkills)
		return 1;
	return cmp_tkill(a, b);
}